

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messagepattern.cpp
# Opt level: O1

int32_t __thiscall
icu_63::MessagePattern::parseMessage
          (MessagePattern *this,int32_t index,int32_t msgStartLength,int32_t nestingLevel,
          UMessagePatternArgType parentType,UParseError *parseError,UErrorCode *errorCode)

{
  char16_t *pcVar1;
  ushort uVar2;
  short sVar3;
  int iVar4;
  bool bVar5;
  uint index_00;
  char16_t cVar6;
  int iVar7;
  char16_t *pcVar8;
  uint uVar9;
  uint index_01;
  int start;
  bool bVar10;
  uint local_58;
  
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    if (nestingLevel < 0x8000) {
      iVar4 = this->partsLength;
      addPart(this,UMSGPAT_PART_TYPE_MSG_START,index,msgStartLength,nestingLevel,errorCode);
      index_01 = msgStartLength + index;
      pcVar1 = (char16_t *)((long)&(this->msg).fUnion + 2);
      bVar10 = (parentType - UMSGPAT_ARG_TYPE_PLURAL & 0xfffffffd) == 0;
      do {
        if (U_ZERO_ERROR < *errorCode) goto LAB_00291b68;
        uVar2 = (this->msg).fUnion.fStackFields.fLengthAndFlags;
        if ((short)uVar2 < 0) {
          uVar9 = (this->msg).fUnion.fFields.fLength;
        }
        else {
          uVar9 = (int)(short)uVar2 >> 5;
        }
        if ((int)uVar9 <= (int)index_01) {
          if ((0 < nestingLevel) &&
             ((parentType != UMSGPAT_ARG_TYPE_CHOICE || nestingLevel != 1 ||
              (((this->partsList->super_MessagePatternList<icu_63::MessagePattern::Part,_32>).a.ptr)
               ->type == UMSGPAT_PART_TYPE_MSG_START)))) {
            setParseError(this,parseError,0);
            *errorCode = U_UNMATCHED_BRACES;
            return 0;
          }
          (this->partsList->super_MessagePatternList<icu_63::MessagePattern::Part,_32>).a.ptr[iVar4]
          .limitPartIndex = this->partsLength;
          addPart(this,UMSGPAT_PART_TYPE_MSG_LIMIT,index_01,0,nestingLevel,errorCode);
          return index_01;
        }
        cVar6 = L'\xffff';
        if (index_01 < uVar9) {
          pcVar8 = pcVar1;
          if ((uVar2 & 2) == 0) {
            pcVar8 = (this->msg).fUnion.fFields.fArray;
          }
          cVar6 = pcVar8[(int)index_01];
        }
        index_00 = index_01 + 1;
        if (cVar6 == L'\'') {
          if (index_00 == uVar9) {
LAB_00291c47:
            addPart(this,UMSGPAT_PART_TYPE_INSERT_CHAR,index_00,0,0x27,errorCode);
            this->needsAutoQuoting = '\x01';
LAB_00291c90:
            bVar5 = true;
          }
          else {
            cVar6 = L'\xffff';
            if (index_00 < uVar9) {
              pcVar8 = pcVar1;
              if ((uVar2 & 2) == 0) {
                pcVar8 = (this->msg).fUnion.fFields.fArray;
              }
              cVar6 = pcVar8[(int)index_00];
            }
            if (cVar6 == L'\'') {
              index_01 = index_01 + 2;
            }
            else {
              uVar9 = index_00;
              if ((((this->aposMode != UMSGPAT_APOS_DOUBLE_REQUIRED) && (cVar6 != L'{')) &&
                  (cVar6 != L'}')) &&
                 ((parentType != UMSGPAT_ARG_TYPE_CHOICE || cVar6 != L'|' &&
                  (cVar6 != L'#' || !bVar10)))) goto LAB_00291c47;
              do {
                addPart(this,UMSGPAT_PART_TYPE_SKIP_SYNTAX,index_01,1,0,errorCode);
                start = 0;
                if (-2 < (int)uVar9) {
                  sVar3 = (this->msg).fUnion.fStackFields.fLengthAndFlags;
                  if (sVar3 < 0) {
                    iVar7 = (this->msg).fUnion.fFields.fLength;
                  }
                  else {
                    iVar7 = (int)sVar3 >> 5;
                  }
                  start = uVar9 + 1;
                  if (iVar7 < (int)(uVar9 + 1)) {
                    start = iVar7;
                  }
                }
                sVar3 = (this->msg).fUnion.fStackFields.fLengthAndFlags;
                if (sVar3 < 0) {
                  iVar7 = (this->msg).fUnion.fFields.fLength;
                }
                else {
                  iVar7 = (int)sVar3 >> 5;
                }
                index_00 = UnicodeString::doIndexOf(&this->msg,L'\'',start,iVar7 - start);
                if ((int)index_00 < 0) {
                  sVar3 = (this->msg).fUnion.fStackFields.fLengthAndFlags;
                  if (sVar3 < 0) {
                    index_01 = (this->msg).fUnion.fFields.fLength;
                  }
                  else {
                    index_01 = (int)sVar3 >> 5;
                  }
                  addPart(this,UMSGPAT_PART_TYPE_INSERT_CHAR,index_01,0,0x27,errorCode);
                  this->needsAutoQuoting = '\x01';
                  goto LAB_00291dd7;
                }
                sVar3 = (this->msg).fUnion.fStackFields.fLengthAndFlags;
                if (sVar3 < 0) {
                  uVar9 = (this->msg).fUnion.fFields.fLength;
                }
                else {
                  uVar9 = (int)sVar3 >> 5;
                }
                index_01 = index_00 + 1;
                if (uVar9 <= index_01) break;
                pcVar8 = pcVar1;
                if (((int)sVar3 & 2U) == 0) {
                  pcVar8 = (this->msg).fUnion.fFields.fArray;
                }
                uVar9 = index_01;
              } while (pcVar8[index_01] == L'\'');
            }
            addPart(this,UMSGPAT_PART_TYPE_SKIP_SYNTAX,index_00,1,0,errorCode);
LAB_00291dd7:
            bVar5 = true;
            index_00 = index_01;
          }
        }
        else {
          if (cVar6 == L'#' && bVar10) {
            addPart(this,UMSGPAT_PART_TYPE_REPLACE_NUMBER,index_01,1,0,errorCode);
            goto LAB_00291c90;
          }
          if (cVar6 == L'{') {
            index_01 = parseArg(this,index_01,1,nestingLevel,parseError,errorCode);
            goto LAB_00291dd7;
          }
          if ((0 < nestingLevel && cVar6 == L'}') ||
             (bVar5 = true, parentType == UMSGPAT_ARG_TYPE_CHOICE && cVar6 == L'|')) {
            local_58 = index_00;
            if (parentType == UMSGPAT_ARG_TYPE_CHOICE) {
              local_58 = index_01;
            }
            (this->partsList->super_MessagePatternList<icu_63::MessagePattern::Part,_32>).a.ptr
            [iVar4].limitPartIndex = this->partsLength;
            addPart(this,UMSGPAT_PART_TYPE_MSG_LIMIT,index_01,
                    (uint)(parentType != UMSGPAT_ARG_TYPE_CHOICE || cVar6 != L'}'),nestingLevel,
                    errorCode);
            bVar5 = false;
          }
        }
        index_01 = index_00;
      } while (bVar5);
    }
    else {
      local_58 = 0;
      *errorCode = U_INDEX_OUTOFBOUNDS_ERROR;
    }
  }
  else {
LAB_00291b68:
    local_58 = 0;
  }
  return local_58;
}

Assistant:

int32_t
MessagePattern::parseMessage(int32_t index, int32_t msgStartLength,
                             int32_t nestingLevel, UMessagePatternArgType parentType,
                             UParseError *parseError, UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) {
        return 0;
    }
    if(nestingLevel>Part::MAX_VALUE) {
        errorCode=U_INDEX_OUTOFBOUNDS_ERROR;
        return 0;
    }
    int32_t msgStart=partsLength;
    addPart(UMSGPAT_PART_TYPE_MSG_START, index, msgStartLength, nestingLevel, errorCode);
    index+=msgStartLength;
    for(;;) {  // while(index<msg.length()) with U_FAILURE(errorCode) check
        if(U_FAILURE(errorCode)) {
            return 0;
        }
        if(index>=msg.length()) {
            break;
        }
        UChar c=msg.charAt(index++);
        if(c==u_apos) {
            if(index==msg.length()) {
                // The apostrophe is the last character in the pattern. 
                // Add a Part for auto-quoting.
                addPart(UMSGPAT_PART_TYPE_INSERT_CHAR, index, 0,
                        u_apos, errorCode);  // value=char to be inserted
                needsAutoQuoting=TRUE;
            } else {
                c=msg.charAt(index);
                if(c==u_apos) {
                    // double apostrophe, skip the second one
                    addPart(UMSGPAT_PART_TYPE_SKIP_SYNTAX, index++, 1, 0, errorCode);
                } else if(
                    aposMode==UMSGPAT_APOS_DOUBLE_REQUIRED ||
                    c==u_leftCurlyBrace || c==u_rightCurlyBrace ||
                    (parentType==UMSGPAT_ARG_TYPE_CHOICE && c==u_pipe) ||
                    (UMSGPAT_ARG_TYPE_HAS_PLURAL_STYLE(parentType) && c==u_pound)
                ) {
                    // skip the quote-starting apostrophe
                    addPart(UMSGPAT_PART_TYPE_SKIP_SYNTAX, index-1, 1, 0, errorCode);
                    // find the end of the quoted literal text
                    for(;;) {
                        index=msg.indexOf(u_apos, index+1);
                        if(index>=0) {
                            if(/*(index+1)<msg.length() &&*/ msg.charAt(index+1)==u_apos) {
                                // double apostrophe inside quoted literal text
                                // still encodes a single apostrophe, skip the second one
                                addPart(UMSGPAT_PART_TYPE_SKIP_SYNTAX, ++index, 1, 0, errorCode);
                            } else {
                                // skip the quote-ending apostrophe
                                addPart(UMSGPAT_PART_TYPE_SKIP_SYNTAX, index++, 1, 0, errorCode);
                                break;
                            }
                        } else {
                            // The quoted text reaches to the end of the of the message.
                            index=msg.length();
                            // Add a Part for auto-quoting.
                            addPart(UMSGPAT_PART_TYPE_INSERT_CHAR, index, 0,
                                    u_apos, errorCode);  // value=char to be inserted
                            needsAutoQuoting=TRUE;
                            break;
                        }
                    }
                } else {
                    // Interpret the apostrophe as literal text.
                    // Add a Part for auto-quoting.
                    addPart(UMSGPAT_PART_TYPE_INSERT_CHAR, index, 0,
                            u_apos, errorCode);  // value=char to be inserted
                    needsAutoQuoting=TRUE;
                }
            }
        } else if(UMSGPAT_ARG_TYPE_HAS_PLURAL_STYLE(parentType) && c==u_pound) {
            // The unquoted # in a plural message fragment will be replaced
            // with the (number-offset).
            addPart(UMSGPAT_PART_TYPE_REPLACE_NUMBER, index-1, 1, 0, errorCode);
        } else if(c==u_leftCurlyBrace) {
            index=parseArg(index-1, 1, nestingLevel, parseError, errorCode);
        } else if((nestingLevel>0 && c==u_rightCurlyBrace) ||
                  (parentType==UMSGPAT_ARG_TYPE_CHOICE && c==u_pipe)) {
            // Finish the message before the terminator.
            // In a choice style, report the "}" substring only for the following ARG_LIMIT,
            // not for this MSG_LIMIT.
            int32_t limitLength=(parentType==UMSGPAT_ARG_TYPE_CHOICE && c==u_rightCurlyBrace) ? 0 : 1;
            addLimitPart(msgStart, UMSGPAT_PART_TYPE_MSG_LIMIT, index-1, limitLength,
                         nestingLevel, errorCode);
            if(parentType==UMSGPAT_ARG_TYPE_CHOICE) {
                // Let the choice style parser see the '}' or '|'.
                return index-1;
            } else {
                // continue parsing after the '}'
                return index;
            }
        }  // else: c is part of literal text
    }
    if(nestingLevel>0 && !inTopLevelChoiceMessage(nestingLevel, parentType)) {
        setParseError(parseError, 0);  // Unmatched '{' braces in message.
        errorCode=U_UNMATCHED_BRACES;
        return 0;
    }
    addLimitPart(msgStart, UMSGPAT_PART_TYPE_MSG_LIMIT, index, 0, nestingLevel, errorCode);
    return index;
}